

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

vector<field::GF2E,_std::allocator<field::GF2E>_> *
field::interpolate_with_precomputation
          (vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
           *precomputed_lagrange_polynomials,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *y_values)

{
  bool bVar1;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *rhs;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *pvVar2;
  runtime_error *this;
  const_reference this_00;
  size_type sVar3;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDX;
  vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
  *in_RSI;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  size_t k;
  size_t m;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *res;
  allocator_type *in_stack_ffffffffffffff90;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *this_01;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_stack_ffffffffffffffb0;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_stack_ffffffffffffffb8;
  ulong local_38;
  
  this_01 = in_RDI;
  rhs = (vector<field::GF2E,_std::allocator<field::GF2E>_> *)
        std::
        vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
        ::size(in_RSI);
  pvVar2 = (vector<field::GF2E,_std::allocator<field::GF2E>_> *)
           std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RDX);
  if ((rhs == pvVar2) &&
     (bVar1 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::empty
                        ((vector<field::GF2E,_std::allocator<field::GF2E>_> *)
                         in_stack_ffffffffffffff90), !bVar1)) {
    this_00 = std::
              vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
              ::operator[](in_RSI,0);
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(this_00);
    std::allocator<field::GF2E>::allocator((allocator<field::GF2E> *)0x12ec63);
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
              (this_01,(size_type)in_RDI,in_stack_ffffffffffffff90);
    std::allocator<field::GF2E>::~allocator((allocator<field::GF2E> *)0x12ec83);
    sVar3 = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(in_RDX);
    for (local_38 = 0; local_38 < sVar3; local_38 = local_38 + 1) {
      std::
      vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
      ::operator[](in_RSI,local_38);
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[](in_RDX,local_38);
      ::operator*(in_stack_ffffffffffffffb8,(GF2E *)in_stack_ffffffffffffffb0);
      operator+=(in_stack_ffffffffffffffb0,rhs);
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::~vector
                ((vector<field::GF2E,_std::allocator<field::GF2E>_> *)in_stack_ffffffffffffff90);
    }
    return this_01;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid sizes for interpolation");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<GF2E> interpolate_with_precomputation(
    const std::vector<std::vector<GF2E>> &precomputed_lagrange_polynomials,
    const std::vector<GF2E> &y_values) {
  if (precomputed_lagrange_polynomials.size() != y_values.size() ||
      y_values.empty())
    throw std::runtime_error("invalid sizes for interpolation");

  std::vector<GF2E> res(precomputed_lagrange_polynomials[0].size());
  size_t m = y_values.size();
  for (size_t k = 0; k < m; k++) {
    res += precomputed_lagrange_polynomials[k] * y_values[k];
  }
  return res;
}